

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::GenerateMacOSXContentStatements
          (cmOSXBundleGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          MacOSXContentGeneratorType *generator)

{
  cmGeneratorTarget *this_00;
  const_iterator cVar1;
  bool bVar2;
  reference ppcVar3;
  SourceFileFlags SVar4;
  SourceFileFlags tsFlags;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_28;
  const_iterator si;
  MacOSXContentGeneratorType *generator_local;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources_local;
  cmOSXBundleGenerator *this_local;
  
  si._M_current = (cmSourceFile **)generator;
  bVar2 = MustSkip(this);
  if (!bVar2) {
    local_28._M_current =
         (cmSourceFile **)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin(sources);
    while( true ) {
      tsFlags.MacFolder =
           (char *)std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                             (sources);
      bVar2 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                          *)&tsFlags.MacFolder);
      if (!bVar2) break;
      this_00 = this->GT;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&local_28);
      SVar4 = cmGeneratorTarget::GetTargetSourceFileFlags(this_00,*ppcVar3);
      cVar1 = si;
      tsFlags._0_8_ = SVar4.MacFolder;
      if (SVar4.Type != SourceFileTypeNormal) {
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&local_28);
        (**(code **)&((*cVar1._M_current)->Location).Directory)
                  (cVar1._M_current,*ppcVar3,tsFlags._0_8_);
      }
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::GenerateMacOSXContentStatements(
  std::vector<cmSourceFile const*> const& sources,
  MacOSXContentGeneratorType* generator)
{
  if (this->MustSkip()) {
    return;
  }

  for (std::vector<cmSourceFile const*>::const_iterator si = sources.begin();
       si != sources.end(); ++si) {
    cmGeneratorTarget::SourceFileFlags tsFlags =
      this->GT->GetTargetSourceFileFlags(*si);
    if (tsFlags.Type != cmGeneratorTarget::SourceFileTypeNormal) {
      (*generator)(**si, tsFlags.MacFolder);
    }
  }
}